

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O3

WJTL_STATUS TestMarshallNumbers(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  JlMarshallElement marshalNumberStruct [14];
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 local_570;
  JlMarshallElement local_568 [14];
  
  memcpy(local_568,&DAT_00141b30,0x540);
  local_5a8 = 0x186a003e80064;
  uStack_5a0 = 10000000000;
  local_598 = 0x7777777777770077;
  uStack_590 = 0x7777777777777777;
  local_588 = 0xfffe7960fc18009c;
  uStack_580 = 0xfffffffdabf41c00;
  local_578 = 0x42c90000;
  local_570 = 0x400199999999999a;
  WVar1 = MakeJsonAndVerify(&local_5a8,local_568,0xe,
                            "{\"u8\":100,\"u16\":1000,\"u32\":100000,\"u64\":10000000000,\"u8h\":119,\"u16h\":30583,\"u32h\":2004318071,\"u64h\":8608480567731124087,\"s8\":-100,\"s16\":-1000,\"s32\":-100000,\"s64\":-10000000000,\"f32\":100.5,\"f64\":2.2}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalNumberStruct, ( sizeof(marshalNumberStruct) / sizeof((marshalNumberStruct)[0]) ), \"{\\\"u8\\\":100,\\\"u16\\\":1000,\\\"u32\\\":100000,\\\"u64\\\":10000000000,\" \"\\\"u8h\\\":119,\\\"u16h\\\":30583,\\\"u32h\\\":2004318071,\\\"u64h\\\":8608480567731124087,\" \"\\\"s8\\\":-100,\\\"s16\\\":-1000,\\\"s32\\\":-100000,\\\"s64\\\":-10000000000,\\\"f32\\\":100.5,\\\"f64\\\":2.2}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallNumbers",0x130);
  WVar2 = MakeJson5AndVerify(&local_5a8,local_568,0xe,
                             "{u8:100,u16:1000,u32:100000,u64:10000000000,u8h:0x77,u16h:0x7777,u32h:0x77777777,u64h:0x7777777777777777,s8:-100,s16:-1000,s32:-100000,s64:-10000000000,f32:100.5,f64:2.2}"
                            );
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalNumberStruct, ( sizeof(marshalNumberStruct) / sizeof((marshalNumberStruct)[0]) ), \"{u8:100,u16:1000,u32:100000,u64:10000000000,\" \"u8h:0x77,u16h:0x7777,u32h:0x77777777,u64h:0x7777777777777777,\" \"s8:-100,s16:-1000,s32:-100000,s64:-10000000000,f32:100.5,f64:2.2}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallNumbers",0x136);
  WVar3 = WJTL_STATUS_FAILED;
  if (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestMarshallNumbers
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t u8;
        uint16_t u16;
        uint32_t u32;
        uint64_t u64;
        uint8_t u8h;
        uint16_t u16h;
        uint32_t u32h;
        uint64_t u64h;
        int8_t s8;
        int16_t s16;
        int32_t s32;
        int64_t s64;
        float f32;
        double f64;
    } NumberStruct;

    JlMarshallElement marshalNumberStruct[] =
    {
        JlMarshallUnsigned( NumberStruct, u8, "u8" ),
        JlMarshallUnsigned( NumberStruct, u16, "u16" ),
        JlMarshallUnsigned( NumberStruct, u32, "u32" ),
        JlMarshallUnsigned( NumberStruct, u64, "u64" ),
        JlMarshallUnsignedHex( NumberStruct, u8h, "u8h" ),
        JlMarshallUnsignedHex( NumberStruct, u16h, "u16h" ),
        JlMarshallUnsignedHex( NumberStruct, u32h, "u32h" ),
        JlMarshallUnsignedHex( NumberStruct, u64h, "u64h" ),
        JlMarshallSigned( NumberStruct, s8, "s8" ),
        JlMarshallSigned( NumberStruct, s16, "s16" ),
        JlMarshallSigned( NumberStruct, s32, "s32" ),
        JlMarshallSigned( NumberStruct, s64, "s64" ),
        JlMarshallFloat( NumberStruct, f32, "f32" ),
        JlMarshallFloat( NumberStruct, f64, "f64" ),
    };

    NumberStruct theStruct = {0};

    // Check numbers
    theStruct.u8 = 100;
    theStruct.u16 = 1000;
    theStruct.u32 = 100000;
    theStruct.u64 = 10000000000;
    theStruct.u8h = 0x77;
    theStruct.u16h = 0x7777;
    theStruct.u32h = 0x77777777;
    theStruct.u64h = 0x7777777777777777;
    theStruct.s8 = -100;
    theStruct.s16 = -1000;
    theStruct.s32 = -100000;
    theStruct.s64 = -10000000000;
    theStruct.f32 = (float)100.5;
    theStruct.f64 = 2.2;
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalNumberStruct, NumElements(marshalNumberStruct),
        "{\"u8\":100,\"u16\":1000,\"u32\":100000,\"u64\":10000000000,"
        "\"u8h\":119,\"u16h\":30583,\"u32h\":2004318071,\"u64h\":8608480567731124087,"
        "\"s8\":-100,\"s16\":-1000,\"s32\":-100000,\"s64\":-10000000000,\"f32\":100.5,\"f64\":2.2}" ) );

    // Now Json5
    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalNumberStruct, NumElements(marshalNumberStruct),
        "{u8:100,u16:1000,u32:100000,u64:10000000000,"
        "u8h:0x77,u16h:0x7777,u32h:0x77777777,u64h:0x7777777777777777,"
        "s8:-100,s16:-1000,s32:-100000,s64:-10000000000,f32:100.5,f64:2.2}" ) );

    return TestReturn;
}